

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O3

REF_STATUS ref_part_meshb_long(FILE *file,REF_INT version,REF_LONG *value)

{
  size_t sVar1;
  undefined8 uVar2;
  char *pcVar3;
  int int_value;
  long long_value;
  int local_14;
  long local_10;
  
  if (version < 4) {
    sVar1 = fread(&local_14,4,1,(FILE *)file);
    if (sVar1 != 1) {
      pcVar3 = "int value";
      uVar2 = 0x2a;
LAB_0018b7a4:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar2,
             "ref_part_meshb_long",pcVar3,1,sVar1);
      return 1;
    }
    local_10 = (long)local_14;
  }
  else {
    sVar1 = fread(&local_10,8,1,(FILE *)file);
    if (sVar1 != 1) {
      pcVar3 = "long value";
      uVar2 = 0x2d;
      goto LAB_0018b7a4;
    }
  }
  *value = local_10;
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_part_meshb_long(FILE *file, REF_INT version,
                                              REF_LONG *value) {
  int int_value;
  long long_value;
  if (version < 4) {
    REIS(1, fread(&int_value, sizeof(int), 1, file), "int value");
    *value = (REF_LONG)int_value;
  } else {
    REIS(1, fread(&long_value, sizeof(long), 1, file), "long value");
    *value = long_value;
  }
  return REF_SUCCESS;
}